

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_InsertValue_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_InsertValue_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  bool bVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pair<const_int,_int> pVar4;
  char *in_R9;
  dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  bool bVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
  insert_it;
  AssertHelper local_a0;
  value_type local_98;
  undefined8 *local_90;
  undefined1 local_88 [32];
  bool local_68;
  AssertHelper local_60;
  undefined1 local_58 [32];
  bool local_38 [16];
  
  bVar5 = (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_elements ==
          (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  local_88[0] = (internal)bVar5;
  local_88._8_8_ = (pointer)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)local_88,(AssertionResult *)"this->ht_.empty()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x376,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_);
    }
    if (local_98 != (value_type)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
    uVar3 = local_88._8_8_;
    if ((pointer)local_88._8_8_ != (pointer)0x0) {
      if (*(pair<const_int,_int> *)local_88._8_8_ != (pair<const_int,_int>)(local_88._8_8_ + 0x10))
      {
        operator_delete((void *)*(pair<const_int,_int> *)local_88._8_8_);
      }
      operator_delete((void *)uVar3);
    }
  }
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  local_88._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(1);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_58,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_88);
  bVar5 = (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_elements !=
          (this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_deleted;
  local_88[0] = (internal)bVar5;
  local_88._8_8_ = (pointer)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_58,(internal *)local_88,(AssertionResult *)"this->ht_.empty()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x378,(char *)local_58._0_8_);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_);
    }
    if (local_98 != (value_type)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
    uVar3 = local_88._8_8_;
    if ((pointer)local_88._8_8_ != (pointer)0x0) {
      if (*(pair<const_int,_int> *)local_88._8_8_ != (pair<const_int,_int>)(local_88._8_8_ + 0x10))
      {
        operator_delete((void *)*(pair<const_int,_int> *)local_88._8_8_);
      }
      operator_delete((void *)uVar3);
    }
  }
  local_88._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0xb);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_58,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_88);
  local_88._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x6f);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_58,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_88);
  local_88._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x457);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_58,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_88);
  local_88._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x2b67);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_58,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_88);
  local_88._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x1b207);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_58,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_88);
  local_88._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x10f447);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_58,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_88);
  local_88._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0xa98ac7);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_58,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_88);
  local_88._0_8_ = UniqueObjectHelper<std::pair<int_const,int>>(0x69f6bc7);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_58,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,(value_type *)local_88);
  local_98.first = 9;
  local_88._0_8_ =
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_elements -
       (this->
       super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ).
       super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.
       super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       .ht_.rep.num_deleted;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_58,"9u","this->ht_.size()",(uint *)&local_98,
             (unsigned_long *)local_88);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((pointer)local_58._8_8_ == (pointer)0x0) {
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar4 = *(pair<const_int,_int> *)local_58._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x381,(char *)pVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((value_type)local_88._0_8_ != (value_type)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  uVar3 = local_58._8_8_;
  if ((pointer)local_58._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_58._8_8_ != (pair<const_int,_int>)(local_58._8_8_ + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_58._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_98.first = 1;
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_a0.data_._0_4_ = pVar4.first;
  this_01 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  pVar6 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&this_01->rep,(int *)&local_a0);
  local_88._1_7_ = 0;
  local_88[0] = (internal)(pVar6.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_58,"1u","this->ht_.count(this->UniqueKey(1))",(uint *)&local_98,
             (unsigned_long *)local_88);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((pointer)local_58._8_8_ == (pointer)0x0) {
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar4 = *(pair<const_int,_int> *)local_58._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x382,(char *)pVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((value_type)local_88._0_8_ != (value_type)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  uVar3 = local_58._8_8_;
  if ((pointer)local_58._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_58._8_8_ != (pair<const_int,_int>)(local_58._8_8_ + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_58._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  local_98.first = 1;
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x457);
  local_a0.data_._0_4_ = pVar4.first;
  pVar6 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>(&this_01->rep,(int *)&local_a0);
  local_88._1_7_ = 0;
  local_88[0] = (internal)(pVar6.first != 0xffffffffffffffff);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_58,"1u","this->ht_.count(this->UniqueKey(1111))",(uint *)&local_98,
             (unsigned_long *)local_88);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if ((pointer)local_58._8_8_ == (pointer)0x0) {
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar4 = *(pair<const_int,_int> *)local_58._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,899,(char *)pVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((value_type)local_88._0_8_ != (value_type)0x0) {
      (**(code **)(*(long *)local_88._0_8_ + 8))();
    }
  }
  if ((pointer)local_58._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_58._8_8_ != (pair<const_int,_int>)(local_58._8_8_ + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_58._8_8_);
    }
    operator_delete((void *)local_58._8_8_);
  }
  local_58._24_8_ = 0;
  local_38[0] = false;
  local_98 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_88,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,&local_98);
  local_58._16_8_ = local_88._16_8_;
  local_58._24_8_ = local_88._24_8_;
  local_58._0_8_ = local_88._0_8_;
  local_58._8_8_ = local_88._8_8_;
  local_38[0] = local_68;
  local_98 = (value_type)((ulong)local_98 & 0xffffffffffffff00);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_88,"false","insert_it.second",(bool *)&local_98,local_38);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if ((pointer)local_88._8_8_ == (pointer)0x0) {
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar4 = *(pair<const_int,_int> *)local_88._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x388,(char *)pVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98 != (value_type)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  uVar3 = local_88._8_8_;
  if ((pointer)local_88._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_88._8_8_ != (pair<const_int,_int>)(local_88._8_8_ + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_88._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  uVar3 = local_58._8_8_;
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  bVar5 = pVar4.second == *(int *)(uVar3 + 4);
  bVar1 = *(int *)uVar3 == pVar4.first;
  local_98.first._0_1_ = bVar5 && bVar1;
  local_90 = (undefined8 *)0x0;
  if (!bVar5 || !bVar1) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_98,
               (AssertionResult *)"*insert_it.first == this->UniqueObject(1)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x389,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_88._0_8_ != (long)local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
    if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
    }
    puVar2 = local_90;
    if (local_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_90 != local_90 + 2) {
        operator_delete((undefined8 *)*local_90);
      }
      operator_delete(puVar2);
    }
  }
  local_98 = UniqueObjectHelper<std::pair<int_const,int>>(2);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
            *)local_88,
           &this_00->
            super_BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ,&local_98);
  local_58._16_8_ = local_88._16_8_;
  local_58._24_8_ = local_88._24_8_;
  local_58._0_8_ = local_88._0_8_;
  local_58._8_8_ = local_88._8_8_;
  local_38[0] = local_68;
  local_98.first._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_88,"true","insert_it.second",(bool *)&local_98,local_38);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if ((pointer)local_88._8_8_ == (pointer)0x0) {
      pVar4 = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
    }
    else {
      pVar4 = *(pair<const_int,_int> *)local_88._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x38c,(char *)pVar4);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98 != (value_type)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  uVar3 = local_88._8_8_;
  if ((pointer)local_88._8_8_ != (pointer)0x0) {
    if (*(pair<const_int,_int> *)local_88._8_8_ != (pair<const_int,_int>)(local_88._8_8_ + 0x10)) {
      operator_delete((void *)*(pair<const_int,_int> *)local_88._8_8_);
    }
    operator_delete((void *)uVar3);
  }
  uVar3 = local_58._8_8_;
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(2);
  bVar5 = pVar4.second == *(int *)(uVar3 + 4);
  bVar1 = *(int *)uVar3 == pVar4.first;
  local_98.first._0_1_ = bVar5 && bVar1;
  local_90 = (undefined8 *)0x0;
  if (!bVar5 || !bVar1) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_98,
               (AssertionResult *)"*insert_it.first == this->UniqueObject(2)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x38d,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_88._0_8_ != (long)local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
    if ((long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a0.data_._4_4_,(int)local_a0.data_) + 8))();
    }
    puVar2 = local_90;
    if (local_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_90 != local_90 + 2) {
        operator_delete((undefined8 *)*local_90);
      }
      operator_delete(puVar2);
    }
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, InsertValue) {
  // First, try some straightforward insertions.
  EXPECT_TRUE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1111)));

  // Check the return type.
  pair<typename TypeParam::iterator, bool> insert_it;
  insert_it = this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(false, insert_it.second);  // false: already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(1));

  insert_it = this->ht_.insert(this->UniqueObject(2));
  EXPECT_EQ(true, insert_it.second);  // true: not already present
  EXPECT_TRUE(*insert_it.first == this->UniqueObject(2));
}